

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O2

int __thiscall CVmFormatter::parse_color_attr(CVmFormatter *this,wchar_t *val,os_color_t *result)

{
  int iVar1;
  wchar_t *pwVar2;
  uint uVar3;
  os_color_t *poVar4;
  os_color_t oVar5;
  
  if (*val == L'#') {
    uVar3 = 0;
    for (pwVar2 = val + 1; *pwVar2 != L'\0'; pwVar2 = pwVar2 + 1) {
      iVar1 = is_xdigit(*pwVar2);
      if (iVar1 == 0) break;
      iVar1 = t3_is_digit(*pwVar2);
      if (iVar1 == 0) {
        iVar1 = (uint)(5 < (uint)(*pwVar2 + L'\xffffff9f')) * 0x20 + -0x57;
      }
      else {
        iVar1 = -0x30;
      }
      uVar3 = uVar3 * 0x10 + *pwVar2 + iVar1;
    }
    oVar5 = (os_color_t)(uVar3 & 0xffffff);
LAB_00236969:
    *result = oVar5;
    iVar1 = 1;
  }
  else {
    for (poVar4 = &color_tbl[0].color_code; ((color_tbl_t *)(poVar4 + -1))->name != (wchar_t *)0x0;
        poVar4 = poVar4 + 2) {
      iVar1 = CVmCaseFoldStr::wstreq(val,((color_tbl_t *)(poVar4 + -1))->name);
      if (iVar1 != 0) {
        oVar5 = *poVar4;
        goto LAB_00236969;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVmFormatter::parse_color_attr(VMG_ const wchar_t *val,
                                   os_color_t *result)
{
    const color_tbl_t *p;

    /* 
     *   if the value starts with '#', it's a hex RGB value; otherwise, it's
     *   a color name 
     */
    if (*val == '#')
    {
        unsigned long hexval;

        /* parse the value as a hex number */
        for (hexval = 0, ++val ; *val != '\0' && is_xdigit(*val) ; ++val)
        {
            /* add this digit */
            hexval <<= 4;
            hexval += (t3_is_digit(*val)
                       ? *val - '0'
                       : *val >= 'a' && *val <= 'f'
                       ? *val - 'a' + 0x0A
                       : *val - 'A' + 0x0A);
        }

        /* 
         *   os_color_t uses the same encoding as HTML, so just return the
         *   value as given (ensuring that it doesn't overflow the 24 bits
         *   assigned to our RGB encoding) 
         */
        *result = (os_color_t)(hexval & 0x00FFFFFF);
        return TRUE;
    }
    else
    {
        /* scan the color table for a match for the name */
        for (p = color_tbl ; p->name != 0 ; ++p)
        {
            /* if the name matches, use it */
            if (CVmCaseFoldStr::wstreq(val, p->name))
            {
                /* this is the color - make it the current buffer color */
                *result = p->color_code;

                /* indicate that we found a valid color value */
                return TRUE;
            }
        }
    }

    /* indicate that we didn't find a valid color value */
    return FALSE;
}